

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

unsigned_long crc32(crc32_t *crc,uchar *data,unsigned_long len)

{
  byte *local_30;
  uchar *ptr;
  unsigned_long r;
  unsigned_long len_local;
  uchar *data_local;
  crc32_t *crc_local;
  
  ptr = (uchar *)crc->init;
  local_30 = data;
  r = len;
  while (r != 0) {
    ptr = (uchar *)((long)ptr << 8 ^ crc->table[(ulong)ptr >> 0x18 ^ (ulong)*local_30]);
    local_30 = local_30 + 1;
    r = r - 1;
  }
  return (crc->xor ^ (ulong)ptr) & 0xffffffff;
}

Assistant:

unsigned long crc32(crc32_t *crc,
                    unsigned char *data, unsigned long len) {
  unsigned long r = crc->init;
  unsigned char *ptr = data;
  while (len--)
    r = (r << 8) ^ crc->table[(r >> 24) ^ *ptr++];

  r ^= crc->xor;
  r &= 0xFFFFFFFF;
  return r;
}